

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O2

void __thiscall
cfd::api::json::ElementsDecodeIssuance::ElementsDecodeIssuance(ElementsDecodeIssuance *this)

{
  _Rb_tree_header *p_Var1;
  allocator local_59;
  allocator local_58;
  allocator local_57;
  allocator local_56;
  allocator local_55;
  allocator local_54;
  allocator local_53;
  allocator local_52;
  allocator local_51;
  string *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  
  (this->super_JsonClassBase<cfd::api::json::ElementsDecodeIssuance>)._vptr_JsonClassBase =
       (_func_int **)&PTR__ElementsDecodeIssuance_00791410;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string((string *)&this->asset_blinding_nonce_,"",&local_51);
  local_38 = &this->asset_blinding_nonce_;
  std::__cxx11::string::string((string *)&this->asset_entropy_,"",&local_52);
  local_40 = &this->asset_entropy_;
  std::__cxx11::string::string((string *)&this->contract_hash_,"",&local_53);
  this->isreissuance_ = false;
  local_48 = &this->contract_hash_;
  std::__cxx11::string::string((string *)&this->token_,"",&local_54);
  local_50 = &this->token_;
  std::__cxx11::string::string((string *)&this->asset_,"",&local_55);
  this->assetamount_ = 0;
  std::__cxx11::string::string((string *)&this->assetamountcommitment_,"",&local_56);
  this->tokenamount_ = 0;
  std::__cxx11::string::string((string *)&this->tokenamountcommitment_,"",&local_57);
  std::__cxx11::string::string((string *)&this->asset_rangeproof_,"",&local_58);
  std::__cxx11::string::string((string *)&this->token_rangeproof_,"",&local_59);
  CollectFieldName();
  return;
}

Assistant:

ElementsDecodeIssuance() {
    CollectFieldName();
  }